

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::_::
concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>>
          (String *__return_storage_ptr__,_ *this,ArrayPtr<const_char> *params,
          ArrayPtr<const_char> *params_1,CappedArray<char,_26UL> *params_2,
          ArrayPtr<const_char> *params_3)

{
  size_t sVar1;
  char *__n;
  char *__dest;
  
  heapString(__return_storage_ptr__,
             (size_t)(params_1->ptr +
                     params->size_ + *(long *)params_2->content + *(long *)(this + 8)));
  __dest = (char *)(__return_storage_ptr__->content).size_;
  if (__dest != (char *)0x0) {
    __dest = (__return_storage_ptr__->content).ptr;
  }
  sVar1 = *(size_t *)(this + 8);
  if (sVar1 != 0) {
    memcpy(__dest,*(void **)this,sVar1);
    __dest = __dest + sVar1;
  }
  sVar1 = params->size_;
  if (sVar1 != 0) {
    memcpy(__dest,params->ptr,sVar1);
    __dest = __dest + sVar1;
  }
  __n = params_1->ptr;
  if (__n != (char *)0x0) {
    memcpy(__dest,&params_1->size_,(size_t)__n);
    __dest = __dest + (long)__n;
  }
  if (*(size_t *)params_2->content != 0) {
    memcpy(__dest,(void *)params_2->currentSize,*(size_t *)params_2->content);
  }
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}